

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O3

int ffgmop(fitsfile *gfptr,long member,fitsfile **mfptr,int *status)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  int unaff_EBP;
  fitsfile *fptr;
  char *pcVar6;
  char nstr [1];
  int hdutype;
  int dummy;
  char *tmpPtr [1];
  int uriCol;
  int locationCol;
  int positionCol;
  int extverCol;
  int extnameCol;
  int xtensionCol;
  long extver;
  long hdupos;
  int grptype;
  char xtension [71];
  char extname [71];
  char uri [71];
  char mbrLocation2 [1025];
  char mbrLocation1 [1025];
  char cwd [1025];
  char grpLocation2 [1025];
  char grpLocation1 [1025];
  char mbrLocation3 [1025];
  
  hdupos = 0;
  extver = 0;
  nstr[0] = '\0';
  if (*status != 0) {
    return *status;
  }
  iVar1 = ffgtgc(gfptr,&xtensionCol,&extnameCol,&extverCol,&positionCol,&locationCol,&uriCol,
                 &grptype,status);
  *status = iVar1;
  if (iVar1 != 0) goto LAB_00182d43;
  iVar1 = ffvcfm(gfptr,xtensionCol,extnameCol,extverCol,positionCol,locationCol,uriCol,status);
  *status = iVar1;
  if (iVar1 != 0) goto LAB_00182d43;
  tmpPtr[0] = xtension;
  if (xtensionCol != 0) {
    iVar1 = ffgcvs(gfptr,xtensionCol,member,1,1,nstr,tmpPtr,&dummy,status);
    *status = iVar1;
    iVar1 = fits_strcasecmp(xtension,"PRIMARY");
    if ((iVar1 == 0) || (iVar1 = fits_strcasecmp(xtension,"IMAGE"), iVar1 == 0)) {
      hdutype = 0;
      unaff_EBP = 0;
    }
    else {
      iVar1 = fits_strcasecmp(xtension,"TABLE");
      if (iVar1 == 0) {
        hdutype = 1;
        unaff_EBP = 1;
      }
      else {
        iVar1 = fits_strcasecmp(xtension,"BINTABLE");
        if (iVar1 == 0) {
          hdutype = 2;
          unaff_EBP = 2;
        }
        else {
          hdutype = -1;
          unaff_EBP = -1;
        }
      }
    }
  }
  tmpPtr[0] = extname;
  if (extnameCol != 0) {
    iVar1 = ffgcvs(gfptr,extnameCol,member,1,1,nstr,tmpPtr,&dummy,status);
    *status = iVar1;
  }
  if (extverCol != 0) {
    iVar1 = ffgcvj(gfptr,extverCol,member,1,1,0,&extver,&dummy,status);
    *status = iVar1;
  }
  if (positionCol != 0) {
    iVar1 = ffgcvj(gfptr,positionCol,member,1,1,0,&hdupos,&dummy,status);
    *status = iVar1;
  }
  tmpPtr[0] = mbrLocation1;
  if (locationCol != 0) {
    iVar1 = ffgcvs(gfptr,locationCol,member,1,1,nstr,tmpPtr,&dummy,status);
    *status = iVar1;
  }
  tmpPtr[0] = uri;
  if (uriCol == 0) {
    iVar1 = *status;
  }
  else {
    iVar1 = ffgcvs(gfptr,uriCol,member,1,1,nstr,tmpPtr,&dummy,status);
    *status = iVar1;
  }
  if ((iVar1 != 0) || (0xc < (uint)grptype)) goto LAB_00182d39;
  if ((0xeU >> (grptype & 0x1fU) & 1) != 0) {
LAB_00182de9:
    iVar1 = ffreopen(gfptr,mfptr,status);
LAB_00182df7:
    *status = iVar1;
    if (iVar1 != 0) goto LAB_00182d39;
    goto LAB_00182e01;
  }
  if ((0x1801U >> (grptype & 0x1fU) & 1) == 0) goto LAB_00182d39;
  if (mbrLocation1[0] == '\0') goto LAB_00182de9;
  iVar1 = fits_strcasecmp(uri,"URL");
  if (iVar1 != 0) {
    *status = 0x68;
    pcVar6 = grpLocation1;
    snprintf(pcVar6,0x51,"Cannot open member HDU file with URI type %s (ffgmop)",uri);
LAB_00182f42:
    ffpmsg(pcVar6);
    goto LAB_00182d39;
  }
  iVar1 = fits_is_url_absolute(mbrLocation1);
  if (iVar1 != 0) {
    ffpmsg("member URL is absolute, try open R/W (ffgmop)");
    iVar1 = ffopentest(10,mfptr,mbrLocation1,1,status);
    *status = iVar1;
    if (iVar1 == 0) goto LAB_00182e01;
    *status = 0;
    ffpmsg("OK, now try to open read-only (ffgmop)");
    pcVar6 = mbrLocation1;
LAB_00182fff:
    iVar1 = ffopentest(10,mfptr,pcVar6,0,status);
    goto LAB_00182df7;
  }
  ffpmsg("Member URL is of type FILE (ffgmop)");
  if (mbrLocation1[0] == '/') {
    ffpmsg("Member URL specifies abs file path (ffgmop)");
    iVar1 = fits_url2path(mbrLocation1,mbrLocation2,status);
    *status = iVar1;
    ffpmsg("Try to open member URL in R/W mode (ffgmop)");
    iVar1 = ffopentest(10,mfptr,mbrLocation2,1,status);
    *status = iVar1;
    if (iVar1 != 0) {
      *status = 0;
      ffpmsg("OK, now try to open read-only (ffgmop)");
      pcVar6 = mbrLocation2;
      goto LAB_00182fff;
    }
    goto LAB_00182e01;
  }
  ffpmsg("Try to open member file as relative URL (ffgmop)");
  iVar1 = fits_get_url(gfptr,grpLocation1,grpLocation2,(char *)0x0,(char *)0x0,(int *)0x0,status);
  *status = iVar1;
  if (grpLocation1[0] == '\0') {
LAB_001831c5:
    if (grpLocation2[0] == '\0') {
LAB_00183349:
      ffpmsg("Cannot open member HDU FITS file (ffgmop)");
      *status = 0x156;
      goto LAB_00182d39;
    }
    iVar1 = fits_is_url_absolute(grpLocation2);
    if ((grpLocation2[0] != '/') && (iVar1 == 0)) {
      fits_get_cwd(cwd,status);
      sVar3 = strlen(cwd);
      sVar4 = strlen(grpLocation2);
      if ((sVar4 + sVar3) - 0x400 < 0xfffffffffffffbff) {
        pcVar6 = "cwd and group location2 is too long (ffgmop)";
        goto LAB_00183238;
      }
      sVar3 = strlen(cwd);
      (cwd + sVar3)[0] = '/';
      (cwd + sVar3)[1] = '\0';
      strcat(cwd,grpLocation2);
      strcpy(grpLocation2,cwd);
    }
    iVar1 = fits_relurl2url(grpLocation2,mbrLocation1,mbrLocation2,status);
    *status = iVar1;
    if (iVar1 != 0) goto LAB_00182d39;
    iVar1 = fits_is_url_absolute(mbrLocation2);
    if (iVar1 == 0) {
      iVar1 = fits_url2path(mbrLocation2,mbrLocation3,status);
      *status = iVar1;
      strcpy(mbrLocation2,mbrLocation3);
    }
    iVar1 = ffopentest(10,mfptr,mbrLocation2,1,status);
    *status = iVar1;
    if (iVar1 != 0) {
      *status = 0;
      ffpmsg("now try to open file as READONLY (ffgmop)");
      iVar1 = ffopentest(10,mfptr,mbrLocation2,0,status);
      *status = iVar1;
      if (iVar1 != 0) {
        *status = 0;
        goto LAB_00183349;
      }
    }
LAB_00182e01:
    if (0xc < (uint)grptype) goto LAB_00182d39;
    if ((9U >> (grptype & 0x1fU) & 1) == 0) {
      if ((0x802U >> (grptype & 0x1fU) & 1) == 0) {
        if ((0x1004U >> (grptype & 0x1fU) & 1) != 0) {
          iVar1 = ffmahd(*mfptr,(int)hdupos,&hdutype,status);
          goto LAB_00182f6d;
        }
        goto LAB_00182d39;
      }
      fptr = *mfptr;
      uVar5 = extver & 0xffffffff;
LAB_00182f20:
      iVar1 = ffmnhd(fptr,unaff_EBP,extname,(int)uVar5,status);
      *status = iVar1;
      if (iVar1 == 0x12d) {
        *status = 0x156;
        pcVar6 = "Cannot find specified member HDU (ffgmop)";
        goto LAB_00182f42;
      }
    }
    else {
      if ((xtension[0] != '\0') && (0 < extver && extname[0] != '\0')) {
        fptr = *mfptr;
        uVar5 = extver;
        goto LAB_00182f20;
      }
      iVar2 = ffmahd(*mfptr,(int)hdupos,&hdutype,status);
      iVar1 = 0x156;
      if (iVar2 != 0x6b) {
        iVar1 = iVar2;
      }
LAB_00182f6d:
      *status = iVar1;
    }
  }
  else {
    iVar1 = fits_is_url_absolute(grpLocation1);
    if ((grpLocation1[0] == '/') || (iVar1 != 0)) {
LAB_001830fc:
      iVar1 = fits_relurl2url(grpLocation1,mbrLocation1,mbrLocation2,status);
      *status = iVar1;
      if (iVar1 != 0) goto LAB_00182d39;
      iVar1 = fits_is_url_absolute(mbrLocation2);
      if (iVar1 == 0) {
        iVar1 = fits_url2path(mbrLocation2,mbrLocation3,status);
        *status = iVar1;
        strcpy(mbrLocation2,mbrLocation3);
      }
      iVar1 = ffopentest(10,mfptr,mbrLocation2,1,status);
      *status = iVar1;
      if (iVar1 != 0) {
        *status = 0;
        ffpmsg("now try to open file as READONLY (ffgmop)");
        iVar1 = ffopentest(10,mfptr,mbrLocation2,0,status);
        *status = iVar1;
        if (iVar1 != 0) {
          *status = 0;
          goto LAB_001831c5;
        }
      }
      goto LAB_00182e01;
    }
    fits_get_cwd(cwd,status);
    sVar3 = strlen(cwd);
    (cwd + sVar3)[0] = '/';
    (cwd + sVar3)[1] = '\0';
    sVar3 = strlen(cwd);
    sVar4 = strlen(grpLocation1);
    if (0xfffffffffffffbfe < (sVar4 + sVar3) - 0x400) {
      strcat(cwd,grpLocation1);
      strcpy(grpLocation1,cwd);
      goto LAB_001830fc;
    }
    pcVar6 = "cwd and group location1 is too long (ffgmop)";
LAB_00183238:
    ffpmsg(pcVar6);
    *status = 0x7d;
LAB_00182d39:
    iVar1 = *status;
  }
  if (iVar1 == 0) {
    return 0;
  }
LAB_00182d43:
  if (*mfptr != (fitsfile *)0x0) {
    ffclos(*mfptr,status);
    iVar1 = *status;
  }
  return iVar1;
}

Assistant:

int ffgmop(fitsfile *gfptr,  /* FITS file pointer to grouping table          */
	   long      member, /* member ID (row num) within grouping table    */
	   fitsfile **mfptr, /* FITS file pointer to member HDU              */
	   int      *status) /* return status code                           */

/*
  open a grouping table member, returning a pointer to the member's FITS file
  with the CHDU set to the member HDU. The grouping table must be the CHDU of
  the FITS file pointed to by gfptr. The member to open is identified by its
  row number within the grouping table (first row/member == 1).

  If the member resides in a FITS file different from the grouping
  table the member file is first opened readwrite and if this fails then
  it is opened readonly. For access type of FILE:// the member file is
  searched for assuming (1) an absolute path is given, (2) a path relative
  to the CWD is given, and (3) a path relative to the grouping table file
  but not relative to the CWD is given. If all of these fail then the
  error FILE_NOT_FOUND is returned.
*/

{
  int xtensionCol,extnameCol,extverCol,positionCol,locationCol,uriCol;
  int grptype,hdutype;
  int dummy;

  long hdupos = 0;
  long extver = 0;

  char  xtension[FLEN_VALUE];
  char  extname[FLEN_VALUE];
  char  uri[FLEN_VALUE];
  char  grpLocation1[FLEN_FILENAME];
  char  grpLocation2[FLEN_FILENAME];
  char  mbrLocation1[FLEN_FILENAME];
  char  mbrLocation2[FLEN_FILENAME];
  char  mbrLocation3[FLEN_FILENAME];
  char  cwd[FLEN_FILENAME];
  char  card[FLEN_CARD];
  char  nstr[] = {'\0'};
  char *tmpPtr[1];


  if(*status != 0) return(*status);

  do
    {
      /*
	retrieve the Grouping Convention reserved column positions within
	the grouping table
      */

      *status = ffgtgc(gfptr,&xtensionCol,&extnameCol,&extverCol,&positionCol,
		       &locationCol,&uriCol,&grptype,status);

      if(*status != 0) continue;
      
      /* verify the column formats */
      
      *status = ffvcfm(gfptr,xtensionCol,extnameCol,extverCol,positionCol,
		       locationCol,uriCol,status);

      if(*status != 0) continue;
      
      /*
	 extract the member information from grouping table
      */

      tmpPtr[0] = xtension;

      if(xtensionCol != 0)
	{

	  *status = fits_read_col_str(gfptr,xtensionCol,member,1,1,nstr,
				      tmpPtr,&dummy,status);

	  /* convert the xtension string to a hdutype code */

	  if(fits_strcasecmp(xtension,"PRIMARY")       == 0) hdutype = IMAGE_HDU; 
	  else if(fits_strcasecmp(xtension,"IMAGE")    == 0) hdutype = IMAGE_HDU; 
	  else if(fits_strcasecmp(xtension,"TABLE")    == 0) hdutype = ASCII_TBL; 
	  else if(fits_strcasecmp(xtension,"BINTABLE") == 0) hdutype = BINARY_TBL; 
	  else hdutype = ANY_HDU; 
	}

      tmpPtr[0] = extname;

      if(extnameCol  != 0)
	  *status = fits_read_col_str(gfptr,extnameCol,member,1,1,nstr,
				      tmpPtr,&dummy,status);

      if(extverCol   != 0)
	  *status = fits_read_col_lng(gfptr,extverCol,member,1,1,0,
				      (long*)&extver,&dummy,status);

      if(positionCol != 0)
	  *status = fits_read_col_lng(gfptr,positionCol,member,1,1,0,
				      (long*)&hdupos,&dummy,status);

      tmpPtr[0] = mbrLocation1;

      if(locationCol != 0)
	*status = fits_read_col_str(gfptr,locationCol,member,1,1,nstr,
				    tmpPtr,&dummy,status);
      tmpPtr[0] = uri;

      if(uriCol != 0)
	*status = fits_read_col_str(gfptr,uriCol,member,1,1,nstr,
				    tmpPtr,&dummy,status);

      if(*status != 0) continue;

      /* 
	 decide what FITS file the member HDU resides in and open the file
	 using the fitsfile* pointer mfptr; note that this logic is rather
	 complicated and is based primiarly upon if a URL specifier is given
	 for the member file in the grouping table
      */

      switch(grptype)
	{

	case GT_ID_POS:
	case GT_ID_REF:
	case GT_ID_ALL:

	  /*
	     no location information is given so we must assume that the
	     member HDU resides in the same FITS file as the grouping table;
	     if the grouping table was incorrectly constructed then this
	     assumption will be false, but there is nothing to be done about
	     it at this point
	  */

	  *status = fits_reopen_file(gfptr,mfptr,status);
	  
	  break;

	case GT_ID_REF_URI:
	case GT_ID_POS_URI:
	case GT_ID_ALL_URI:

	  /*
	    The member location column exists. Determine if the member 
	    resides in the same file as the grouping table or in a
	    separate file; open the member file in either case
	  */

	  if(strlen(mbrLocation1) == 0)
	    {
	      /*
		 since no location information was given we must assume
		 that the member is in the same FITS file as the grouping
		 table
	      */

	      *status = fits_reopen_file(gfptr,mfptr,status);
	    }
	  else
	    {
	      /*
		make sure the location specifiation is "URL"; we cannot
		decode any other URI types at this time
	      */

	      if(fits_strcasecmp(uri,"URL") != 0)
		{
		  *status = FILE_NOT_OPENED;
		  snprintf(card,FLEN_CARD,
		  "Cannot open member HDU file with URI type %s (ffgmop)",
			  uri);
		  ffpmsg(card);

		  continue;
		}

	      /*
		The location string for the member is not NULL, so it 
		does not necessially reside in the same FITS file as the
		grouping table. 

		Three cases are attempted for opening the member's file
		in the following order:

		1. The URL given for the member's file is absolute (i.e.,
		access method supplied); try to open the member

		2. The URL given for the member's file is not absolute but
		is an absolute file path; try to open the member as a file
		after the file path is converted to a host-dependent form

		3. The URL given for the member's file is not absolute
	        and is given as a relative path to the location of the 
		grouping table's file. Create an absolute URL using the 
		grouping table's file URL and try to open the member.
		
		If all three cases fail then an error is returned. In each
		case the file is first opened in read/write mode and failing
		that readonly mode.
		
		The following DO loop is only used as a mechanism to break
		(continue) when the proper file opening method is found
	       */

	      do
		{
		  /*
		     CASE 1:

		     See if the member URL is absolute (i.e., includes a
		     access directive) and if so open the file
		   */

		  if(fits_is_url_absolute(mbrLocation1))
		    {
		      /*
			 the URL must specify an access method, which 
			 implies that its an absolute reference
			 
			 regardless of the access method, pass the whole
			 URL to the open function for processing
		       */
		      
		      ffpmsg("member URL is absolute, try open R/W (ffgmop)");

		      *status = fits_open_file(mfptr,mbrLocation1,READWRITE,
					       status);

		      if(*status == 0) continue;

		      *status = 0;

		      /* 
			 now try to open file using full URL specs in 
			 readonly mode 
		      */ 

		      ffpmsg("OK, now try to open read-only (ffgmop)");

		      *status = fits_open_file(mfptr,mbrLocation1,READONLY,
					       status);

		      /* break from DO loop regardless of status */

		      continue;
		    }

		  /*
		     CASE 2:

		     If we got this far then the member URL location 
		     has no access type ==> FILE:// Try to open the member 
		     file using the URL as is, i.e., assume that it is given 
		     as absolute, if it starts with a '/' character
		   */

		  ffpmsg("Member URL is of type FILE (ffgmop)");

		  if(*mbrLocation1 == '/')
		    {
		      ffpmsg("Member URL specifies abs file path (ffgmop)");

		      /* 
			 convert the URL path to a host dependent path
		      */

		      *status = fits_url2path(mbrLocation1,mbrLocation2,
					      status);

		      ffpmsg("Try to open member URL in R/W mode (ffgmop)");

		      *status = fits_open_file(mfptr,mbrLocation2,READWRITE,
					       status);

		      if(*status == 0) continue;

		      *status = 0;

		      /* 
			 now try to open file using the URL as an absolute 
			 path in readonly mode 
		      */
 
		      ffpmsg("OK, now try to open read-only (ffgmop)");

		      *status = fits_open_file(mfptr,mbrLocation2,READONLY,
					       status);

		      /* break from the Do loop regardless of the status */

		      continue;
		    }
		  
		  /* 
		     CASE 3:

		     If we got this far then the URL does not specify an
		     absoulte file path or URL with access method. Since 
		     the path to the group table's file is (obviously) valid 
		     for the CWD, create a full location string for the
		     member HDU using the grouping table URL as a basis

		     The only problem is that the grouping table file might
		     have two URLs, the original one used to open it and
		     the one that points to the real file being accessed
		     (i.e., a file accessed via HTTP but transferred to a
		     local disk file). Have to attempt to build a URL to
		     the member HDU file using both of these URLs if
		     defined.
		  */

		  ffpmsg("Try to open member file as relative URL (ffgmop)");

		  /* get the URL information for the grouping table file */

		  *status = fits_get_url(gfptr,grpLocation1,grpLocation2,
					 NULL,NULL,NULL,status);

		  /* 
		     if the "real" grouping table file URL is defined then
		     build a full url for the member HDU file using it
		     and try to open the member HDU file
		  */

		  if(*grpLocation1)
		    {
		      /* make sure the group location is absolute */

		      if(! fits_is_url_absolute(grpLocation1) &&
			                              *grpLocation1 != '/')
			{
			  fits_get_cwd(cwd,status);
			  strcat(cwd,"/");
                          if (strlen(cwd)+strlen(grpLocation1)+1 > 
                                    FLEN_FILENAME-1)
                          {
                             ffpmsg("cwd and group location1 is too long (ffgmop)");
                             *status = URL_PARSE_ERROR;
                             continue;
                          }
			  strcat(cwd,grpLocation1);
			  strcpy(grpLocation1,cwd);
			}

		      /* create a full URL for the member HDU file */

		      *status = fits_relurl2url(grpLocation1,mbrLocation1,
						mbrLocation2,status);

		      if(*status != 0) continue;

		      /*
			if the URL does not have an access method given then
			translate it into a host dependent file path
		      */

		      if(! fits_is_url_absolute(mbrLocation2))
			{
			  *status = fits_url2path(mbrLocation2,mbrLocation3,
						  status);
			  strcpy(mbrLocation2,mbrLocation3);
			}

		      /* try to open the member file READWRITE */

		      *status = fits_open_file(mfptr,mbrLocation2,READWRITE,
					       status);

		      if(*status == 0) continue;

		      *status = 0;
		  
		      /* now try to open in readonly mode */ 

		      ffpmsg("now try to open file as READONLY (ffgmop)");

		      *status = fits_open_file(mfptr,mbrLocation2,READONLY,
					       status);

		      if(*status == 0) continue;

		      *status = 0;
		    }

		  /* 
		     if we got this far then either the "real" grouping table
		     file URL was not defined or all attempts to open the
		     resulting member HDU file URL failed.

		     if the "original" grouping table file URL is defined then
		     build a full url for the member HDU file using it
		     and try to open the member HDU file
		  */

		  if(*grpLocation2)
		    {
		      /* make sure the group location is absolute */

		      if(! fits_is_url_absolute(grpLocation2) &&
			                              *grpLocation2 != '/')
			{
			  fits_get_cwd(cwd,status);
                          if (strlen(cwd)+strlen(grpLocation2)+1 > 
                                    FLEN_FILENAME-1)
                          {
                             ffpmsg("cwd and group location2 is too long (ffgmop)");
                             *status = URL_PARSE_ERROR;
                             continue;
                          }
			  strcat(cwd,"/");
			  strcat(cwd,grpLocation2);
			  strcpy(grpLocation2,cwd);
			}

		      /* create an absolute URL for the member HDU file */

		      *status = fits_relurl2url(grpLocation2,mbrLocation1,
						mbrLocation2,status);
		      if(*status != 0) continue;

		      /*
			if the URL does not have an access method given then
			translate it into a host dependent file path
		      */

		      if(! fits_is_url_absolute(mbrLocation2))
			{
			  *status = fits_url2path(mbrLocation2,mbrLocation3,
						  status);
			  strcpy(mbrLocation2,mbrLocation3);
			}

		      /* try to open the member file READWRITE */

		      *status = fits_open_file(mfptr,mbrLocation2,READWRITE,
					       status);

		      if(*status == 0) continue;

		      *status = 0;
		  
		      /* now try to open in readonly mode */ 

		      ffpmsg("now try to open file as READONLY (ffgmop)");

		      *status = fits_open_file(mfptr,mbrLocation2,READONLY,
					       status);

		      if(*status == 0) continue;

		      *status = 0;
		    }

		  /*
		     if we got this far then the member HDU file could not
		     be opened using any method. Log the error.
		  */

		  ffpmsg("Cannot open member HDU FITS file (ffgmop)");
		  *status = MEMBER_NOT_FOUND;
		  
		}while(0);
	    }

	  break;

	default:

	  /* no default action */
	  
	  break;
	}
	  
      if(*status != 0) continue;

      /*
	 attempt to locate the member HDU within its FITS file as determined
	 and opened above
      */

      switch(grptype)
	{

	case GT_ID_POS:
	case GT_ID_POS_URI:

	  /*
	    try to find the member hdu in the the FITS file pointed to
	    by mfptr based upon its HDU posistion value. Note that is 
	    impossible to verify if the HDU is actually the correct HDU due 
	    to a lack of information.
	  */
	  
	  *status = fits_movabs_hdu(*mfptr,(int)hdupos,&hdutype,status);

	  break;

	case GT_ID_REF:
	case GT_ID_REF_URI:

	  /*
	     try to find the member hdu in the FITS file pointed to
	     by mfptr based upon its XTENSION, EXTNAME and EXTVER keyword 
	     values
	  */

	  *status = fits_movnam_hdu(*mfptr,hdutype,extname,extver,status);

	  if(*status == BAD_HDU_NUM) 
	    {
	      *status = MEMBER_NOT_FOUND;
	      ffpmsg("Cannot find specified member HDU (ffgmop)");
	    }

	  /*
	     if the above function returned without error then the
	     mfptr is pointed to the member HDU
	  */

	  break;

	case GT_ID_ALL:
	case GT_ID_ALL_URI:

	  /*
	     if the member entry has reference information then use it
             (ID by reference is safer than ID by position) else use
	     the position information
	  */

	  if(strlen(xtension) > 0 && strlen(extname) > 0 && extver > 0)
	    {
	      /* valid reference info exists so use it */
	      
	      /* try to find the member hdu in the grouping table's file */

	      *status = fits_movnam_hdu(*mfptr,hdutype,extname,extver,status);

	      if(*status == BAD_HDU_NUM) 
		{
		  *status = MEMBER_NOT_FOUND;
		  ffpmsg("Cannot find specified member HDU (ffgmop)");
		}
	    }
	  else
	      {
		  *status = fits_movabs_hdu(*mfptr,(int)hdupos,&hdutype,
					    status);
		  if(*status == END_OF_FILE) *status = MEMBER_NOT_FOUND;
	      }

	  /*
	     if the above function returned without error then the
	     mfptr is pointed to the member HDU
	  */

	  break;

	default:

	  /* no default action */

	  break;
	}
      
    }while(0);

  if(*status != 0 && *mfptr != NULL) 
    {
      fits_close_file(*mfptr,status);
    }

  return(*status);
}